

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::remove_timeout(Fl_Timeout_Handler cb,void *argp)

{
  Timeout *pTVar1;
  Timeout *t;
  Timeout **p;
  void *argp_local;
  Fl_Timeout_Handler cb_local;
  
  t = (Timeout *)&first_timeout;
  while (t->time != 0.0) {
    pTVar1 = (Timeout *)t->time;
    if ((pTVar1->cb == cb) && ((pTVar1->arg == argp || (argp == (void *)0x0)))) {
      t->time = (double)pTVar1->next;
      pTVar1->next = free_timeout;
      free_timeout = pTVar1;
    }
    else {
      t = (Timeout *)&pTVar1->next;
    }
  }
  return;
}

Assistant:

void Fl::remove_timeout(Fl_Timeout_Handler cb, void *argp) {
  for (Timeout** p = &first_timeout; *p;) {
    Timeout* t = *p;
    if (t->cb == cb && (t->arg == argp || !argp)) {
      *p = t->next;
      t->next = free_timeout;
      free_timeout = t;
    } else {
      p = &(t->next);
    }
  }
}